

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

bool fp::API::wallFront(void)

{
  bool bVar1;
  ostream *poVar2;
  string response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"wallFront");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&local_30);
  bVar1 = std::operator==(&local_30,"true");
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool fp::API::wallFront() {
    std::cout << "wallFront" << std::endl;
    std::string response;
    std::cin >> response;
    return response == "true";
}